

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::TrackAllocCore
          (Recycler *this,void *object,size_t size,TrackAllocData *trackAllocData,bool traceLifetime
          )

{
  code *pcVar1;
  TrackAllocData *pTVar2;
  bool bVar3;
  TrackerData *pTVar4;
  undefined4 *puVar5;
  size_t sVar6;
  NoCheckHeapAllocator *pNVar7;
  TrackerItem *pTVar8;
  char16_t *form;
  char *pcVar9;
  TrackerData *local_160;
  TrackerData *data;
  TrackAllocData local_e8;
  code *local_a0;
  undefined8 local_98;
  TrackAllocData local_90;
  size_t local_68;
  size_t stackTraceSize;
  ulong uStack_58;
  bool isArray;
  size_t itemSize;
  size_t allocCount;
  TrackerItem *item;
  TrackerItem **local_38;
  type_info **typeInfo;
  TrackAllocData *pTStack_28;
  bool traceLifetime_local;
  TrackAllocData *trackAllocData_local;
  size_t size_local;
  void *object_local;
  Recycler *this_local;
  
  typeInfo._7_1_ = traceLifetime;
  pTStack_28 = trackAllocData;
  trackAllocData_local = (TrackAllocData *)size;
  size_local = (size_t)object;
  object_local = this;
  item = (TrackerItem *)TrackAllocData::GetTypeInfo(trackAllocData);
  local_38 = &item;
  if ((DAT_01eca381 & 1) != 0) {
    TrackFree(this,(char *)size_local,(size_t)trackAllocData_local);
  }
  pTVar4 = GetTrackerData(this,(void *)size_local);
  if ((pTVar4 != (TrackerData *)0x0) &&
     (pTVar4 = GetTrackerData(this,(void *)size_local),
     pTVar4 != &TrackerData::ExplicitFreeListObjectData)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1ffb,
                       "(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData)"
                       ,
                       "GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (*local_38 == (TrackerItem *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1ffc,"(typeInfo != nullptr)","typeInfo != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  itemSize = TrackAllocData::GetCount(pTStack_28);
  pTVar2 = trackAllocData_local;
  sVar6 = TrackAllocData::GetPlusSize(pTStack_28);
  uStack_58 = (long)pTVar2 - sVar6;
  bVar3 = itemSize == 0xffffffffffffffff;
  if (bVar3) {
    itemSize = 1;
  }
  else {
    uStack_58 = uStack_58 / itemSize;
  }
  stackTraceSize._7_1_ = !bVar3;
  bVar3 = JsUtil::
          BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<std::type_info_const*>
                    ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->trackerDictionary,(type_info **)local_38,(TrackerItem **)&allocCount);
  if (bVar3) {
    if (*(TrackerItem **)allocCount != *local_38) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2021,"(item->instanceData.typeinfo == typeInfo)",
                         "item->instanceData.typeinfo == typeInfo");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (*(ulong *)(allocCount + 0x10) != uStack_58) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2022,"(item->instanceData.ItemSize == itemSize)",
                         "item->instanceData.ItemSize == itemSize");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (*(ulong *)(allocCount + 0x58) != uStack_58) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x2023,"(item->arrayData.ItemSize == itemSize)",
                         "item->arrayData.ItemSize == itemSize");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    if (((DAT_01eca381 & 1) == 0) || ((stackTraceSize._7_1_ & 1) == 0)) {
      TrackAllocData::CreateTrackAllocData
                (&local_e8,(type_info *)&TrackerItem::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                 ,0x2018);
      pNVar7 = NoCheckHeapAllocator::TrackAllocInfo
                         ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&local_e8);
      pTVar8 = (TrackerItem *)new<Memory::NoCheckHeapAllocator>(0x90,pNVar7,0x3d5f00);
      TrackerItem::TrackerItem(pTVar8,(type_info *)*local_38);
      allocCount = (size_t)pTVar8;
    }
    else {
      local_68 = 0x80;
      TrackAllocData::CreateTrackAllocData
                (&local_90,(type_info *)&TrackerItem::typeinfo,0x80,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                 ,0x2012);
      pNVar7 = NoCheckHeapAllocator::TrackAllocInfo
                         ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&local_90);
      local_a0 = NoCheckHeapAllocator::Alloc;
      local_98 = 0;
      pTVar8 = (TrackerItem *)new<Memory::NoCheckHeapAllocator>(0x90,pNVar7,0x3d5f00,0);
      TrackerItem::TrackerItem(pTVar8,(type_info *)*local_38);
      allocCount = (size_t)pTVar8;
      StackBackTrace::Capture((char *)(pTVar8 + 1),local_68,7);
    }
    *(ulong *)(allocCount + 0x10) = uStack_58;
    *(ulong *)(allocCount + 0x58) = uStack_58;
    JsUtil::
    BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Item(this->trackerDictionary,(type_info **)local_38,(TrackerItem **)&allocCount);
  }
  if ((stackTraceSize._7_1_ & 1) == 0) {
    local_160 = (TrackerData *)allocCount;
  }
  else {
    local_160 = (TrackerData *)(allocCount + 0x48);
  }
  local_160->ItemCount = itemSize + local_160->ItemCount;
  local_160->AllocCount = local_160->AllocCount + 1;
  local_160->ReqSize = (long)&trackAllocData_local->typeinfo + local_160->ReqSize;
  sVar6 = HeapInfo::GetAlignedSizeNoCheck((size_t)trackAllocData_local);
  local_160->AllocSize = sVar6 + local_160->AllocSize;
  local_160->TraceLifetime = (bool)(typeInfo._7_1_ & 1);
  if ((typeInfo._7_1_ & 1) != 0) {
    form = L"Allocated %S %p\n";
    if ((local_160->isArray & 1U) != 0) {
      form = L"Allocated %S[] %p\n";
    }
    pcVar9 = std::type_info::name(local_160->typeinfo);
    Output::Print(form,pcVar9,size_local);
  }
  SetTrackerData(this,(void *)size_local,local_160);
  return;
}

Assistant:

void
Recycler::TrackAllocCore(void * object, size_t size, const TrackAllocData& trackAllocData, bool traceLifetime)
{
    auto&& typeInfo = trackAllocData.GetTypeInfo();
    if (CONFIG_FLAG(KeepRecyclerTrackData))
    {
        TrackFree((char*)object, size);
    }

    Assert(GetTrackerData(object) == nullptr || GetTrackerData(object) == &TrackerData::ExplicitFreeListObjectData);
    Assert(typeInfo != nullptr);
    TrackerItem * item;
    size_t allocCount = trackAllocData.GetCount();
    size_t itemSize = (size - trackAllocData.GetPlusSize());
    bool isArray;
    if (allocCount != (size_t)-1)
    {
        isArray = true;
        itemSize = itemSize / allocCount;
    }
    else
    {
        isArray = false;
        allocCount = 1;
    }

    if (!trackerDictionary->TryGetValue(typeInfo, &item))
    {
#ifdef STACK_BACK_TRACE
        if (CONFIG_FLAG(KeepRecyclerTrackData) && isArray) // type info is not useful record stack instead
        {
            size_t stackTraceSize = 16 * sizeof(void*);
            item = NoCheckHeapNewPlus(stackTraceSize, TrackerItem, typeInfo);
            StackBackTrace::Capture((char*)&item[1], stackTraceSize, 7);
        }
        else
#endif
        {
            item = NoCheckHeapNew(TrackerItem, typeInfo);
        }

        item->instanceData.ItemSize = itemSize;
        item->arrayData.ItemSize = itemSize;
        trackerDictionary->Item(typeInfo, item);
    }
    else
    {
        Assert(item->instanceData.typeinfo == typeInfo);
        Assert(item->instanceData.ItemSize == itemSize);
        Assert(item->arrayData.ItemSize == itemSize);
    }
    TrackerData& data = (isArray)? item->arrayData : item->instanceData;
        data.ItemCount += allocCount;
        data.AllocCount++;
        data.ReqSize += size;
        data.AllocSize += HeapInfo::GetAlignedSizeNoCheck(size);
#ifdef TRACE_OBJECT_LIFETIME
    data.TraceLifetime = traceLifetime;

    if (traceLifetime)
    {
        Output::Print(data.isArray ? _u("Allocated %S[] %p\n") : _u("Allocated %S %p\n"), data.typeinfo->name(), object);
    }
#endif
#ifdef PERF_COUNTERS
    ++data.counter;
    data.sizeCounter += HeapInfo::GetAlignedSizeNoCheck(size);
#endif

    SetTrackerData(object, &data);
}